

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall
Fl_Text_Display::wrapped_line_counter
          (Fl_Text_Display *this,Fl_Text_Buffer *buf,int startPos,int maxPos,int maxLines,
          bool startPosIsLineStart,int styleBufOffset,int *retPos,int *retLines,int *retLineStart,
          int *retLineEnd,bool countLastLineMissingNewLine)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int pos;
  int pos_00;
  int iVar6;
  int pos_01;
  char *pcVar7;
  undefined3 in_register_00000089;
  int iVar8;
  double dVar9;
  double local_60;
  
  iVar6 = this->mWrapMarginPix;
  if (iVar6 == 0) {
    iVar6 = (this->text_area).w;
  }
  if (CONCAT31(in_register_00000089,startPosIsLineStart) == 0) {
    startPos = line_start(this,startPos);
  }
  if (startPos < buf->mLength) {
    local_60 = 0.0;
    pos_01 = 0;
    iVar8 = 0;
    iVar4 = startPos;
    pos_00 = startPos;
    do {
      uVar2 = Fl_Text_Buffer::char_at(buf,pos_00);
      if (uVar2 == 10) {
        if (pos_00 < maxPos) {
          pos_01 = pos_01 + 1;
          startPos = Fl_Text_Buffer::next_char(buf,pos_00);
          if (pos_01 < maxLines) {
            local_60 = 0.0;
            iVar8 = 0;
            iVar4 = startPos;
            goto LAB_001d3776;
          }
          *retPos = startPos;
          *retLines = pos_01;
          *retLineStart = startPos;
        }
        else {
          *retPos = maxPos;
          *retLines = pos_01;
LAB_001d39ba:
          *retLineStart = startPos;
          pos_00 = maxPos;
        }
        goto LAB_001d3a4e;
      }
      pcVar7 = buf->mBuf + pos_00 + ((long)buf->mGapEnd - (long)buf->mGapStart);
      if (pos_00 < buf->mGapStart) {
        pcVar7 = buf->mBuf + pos_00;
      }
      iVar8 = iVar8 + 1;
      dVar9 = measure_proportional_character(this,pcVar7,(int)local_60,pos_00 + styleBufOffset);
      local_60 = local_60 + dVar9;
LAB_001d3776:
      iVar5 = startPos;
      if ((double)iVar6 < local_60) {
        iVar3 = pos_00;
        if (startPos <= pos_00) {
LAB_001d378e:
          uVar2 = Fl_Text_Buffer::char_at(buf,iVar3);
          if ((uVar2 != 0x20) && (uVar2 != 9)) goto code_r0x001d37a6;
          iVar4 = Fl_Text_Buffer::next_char(buf,iVar3);
          iVar5 = Fl_Text_Buffer::next_char(buf,pos_00);
          pos = Fl_Text_Buffer::next_char(buf,iVar3);
          if (pos < iVar5) {
            iVar8 = 0;
            local_60 = 0.0;
            do {
              pcVar7 = buf->mBuf + pos + ((long)buf->mGapEnd - (long)buf->mGapStart);
              if (pos < buf->mGapStart) {
                pcVar7 = buf->mBuf + pos;
              }
              dVar9 = measure_proportional_character(this,pcVar7,(int)local_60,styleBufOffset + pos)
              ;
              local_60 = dVar9 + local_60;
              iVar8 = iVar8 + 1;
              pos = Fl_Text_Buffer::next_char(buf,pos);
            } while (pos < iVar5);
          }
          else {
            local_60 = 0.0;
            iVar8 = 0;
          }
          bVar1 = false;
          iVar5 = startPos;
          goto LAB_001d38de;
        }
LAB_001d37b7:
        iVar3 = Fl_Text_Buffer::next_char(buf,startPos);
        if (iVar3 < pos_00) {
          iVar3 = pos_00;
        }
        iVar8 = iVar8 + 1;
        local_60 = 0.0;
        if (startPos < buf->mLength) {
          pcVar7 = buf->mBuf + startPos + ((long)buf->mGapEnd - (long)buf->mGapStart);
          if (startPos < buf->mGapStart) {
            pcVar7 = buf->mBuf + startPos;
          }
          local_60 = measure_proportional_character(this,pcVar7,0,pos_00 + styleBufOffset);
        }
        bVar1 = true;
        iVar5 = iVar4;
        iVar4 = iVar3;
        iVar3 = startPos;
LAB_001d38de:
        if (maxPos <= pos_00) {
          *retPos = maxPos;
          startPos = iVar5;
          if (iVar4 <= maxPos) {
            startPos = iVar4;
          }
          *retLines = pos_01 + (uint)(iVar4 <= maxPos);
          goto LAB_001d39ba;
        }
        pos_01 = pos_01 + 1;
        iVar5 = iVar4;
        if (maxLines <= pos_01) {
          if (bVar1) {
            iVar6 = Fl_Text_Buffer::next_char(buf,startPos);
            if (iVar6 < pos_00) {
              iVar6 = pos_00;
            }
          }
          else {
            iVar6 = Fl_Text_Buffer::next_char(buf,iVar3);
            pos_00 = iVar3;
          }
          *retPos = iVar6;
          *retLines = pos_01;
          *retLineStart = startPos;
          goto LAB_001d3a4e;
        }
      }
      startPos = iVar5;
      pos_00 = Fl_Text_Buffer::next_char(buf,pos_00);
    } while (pos_00 < buf->mLength);
    *retPos = buf->mLength;
    *retLines = pos_01;
    if ((!countLastLineMissingNewLine) || (iVar8 < 1)) goto LAB_001d3975;
    iVar6 = Fl_Text_Buffer::next_char(buf,pos_01);
  }
  else {
    *retPos = buf->mLength;
    iVar6 = 0;
  }
  *retLines = iVar6;
LAB_001d3975:
  *retLineStart = startPos;
  pos_00 = buf->mLength;
LAB_001d3a4e:
  *retLineEnd = pos_00;
  return;
code_r0x001d37a6:
  iVar3 = Fl_Text_Buffer::prev_char(buf,iVar3);
  if (iVar3 < startPos) goto LAB_001d37b7;
  goto LAB_001d378e;
}

Assistant:

void Fl_Text_Display::wrapped_line_counter(Fl_Text_Buffer *buf, int startPos,
                                           int maxPos, int maxLines, bool startPosIsLineStart, int styleBufOffset,
                                           int *retPos, int *retLines, int *retLineStart, int *retLineEnd,
                                           bool countLastLineMissingNewLine) const {
  IS_UTF8_ALIGNED2(buf, startPos)
  IS_UTF8_ALIGNED2(buf, maxPos)

  int lineStart, newLineStart = 0, b, p, colNum, wrapMarginPix;
  int i, foundBreak;
  double width;
  int nLines = 0;
  unsigned int c;

  /* Set the wrap margin to the wrap column or the view width */
  if (mWrapMarginPix != 0) {
    wrapMarginPix = mWrapMarginPix;
  } else {
    wrapMarginPix = text_area.w;
  }

  /* Find the start of the line if the start pos is not marked as a
   line start. */
  if (startPosIsLineStart)
    lineStart = startPos;
  else
    lineStart = line_start(startPos);

  /*
   ** Loop until position exceeds maxPos or line count exceeds maxLines.
   ** (actually, continues beyond maxPos to end of line containing maxPos,
   ** in case later characters cause a word wrap back before maxPos)
   */
  colNum = 0;
  width = 0;
  for (p=lineStart; p<buf->length(); p=buf->next_char(p)) {
    c = buf->char_at(p);  // UCS-4

    /* If the character was a newline, count the line and start over,
     otherwise, add it to the width and column counts */
    if (c == '\n') {
      if (p >= maxPos) {
        *retPos = maxPos;
        *retLines = nLines;
        *retLineStart = lineStart;
        *retLineEnd = maxPos;
        return;
      }
      nLines++;
      int p1 = buf->next_char(p);
      if (nLines >= maxLines) {
        *retPos = p1;
        *retLines = nLines;
        *retLineStart = p1;
        *retLineEnd = p;
        return;
      }
      lineStart = p1;
      colNum = 0;
      width = 0;
    } else {
      const char *s = buf->address(p);
      colNum++;
      // FIXME: it is not a good idea to simply add character widths because on
      // some platforms, the width is a floating point value and depends on the
      // previous character as well.
      width += measure_proportional_character(s, (int)width, p+styleBufOffset);
    }

    /* If character exceeded wrap margin, find the break point and wrap there */
    if (width > wrapMarginPix) {
      foundBreak = false;
      for (b=p; b>=lineStart; b=buf->prev_char(b)) {
        c = buf->char_at(b);
        if (c == '\t' || c == ' ') {
          newLineStart = buf->next_char(b);
          colNum = 0;
          width = 0;
          int iMax = buf->next_char(p);
          for (i=buf->next_char(b); i<iMax; i = buf->next_char(i)) {
            width += measure_proportional_character(buf->address(i), (int)width,
                                                    i+styleBufOffset);
            colNum++;
          }
          foundBreak = true;
          break;
        }
      }
      if (b<lineStart) b = lineStart;
      if (!foundBreak) { /* no whitespace, just break at margin */
        newLineStart = max(p, buf->next_char(lineStart));
        colNum++;
	if (b >= buf->length()) { // STR #2730
	  width = 0;
	} else {
	  const char *s = buf->address(b);
	  width = measure_proportional_character(s, 0, p+styleBufOffset);
	}
      }
      if (p >= maxPos) {
        *retPos = maxPos;
        *retLines = maxPos < newLineStart ? nLines : nLines + 1;
        *retLineStart = maxPos < newLineStart ? lineStart : newLineStart;
        *retLineEnd = maxPos;
        return;
      }
      nLines++;
      if (nLines >= maxLines) {
        *retPos = foundBreak ? buf->next_char(b) : max(p, buf->next_char(lineStart));
        *retLines = nLines;
        *retLineStart = lineStart;
        *retLineEnd = foundBreak ? b : p;
        return;
      }
      lineStart = newLineStart;
    }
  }

  /* reached end of buffer before reaching pos or line target */
  *retPos = buf->length();
  *retLines = nLines;
  if (countLastLineMissingNewLine && colNum > 0)
    *retLines = buf->next_char(*retLines);
  *retLineStart = lineStart;
  *retLineEnd = buf->length();
}